

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slider.cpp
# Opt level: O0

bool __thiscall ftxui::SliderBase<float>::OnMouseEvent(SliderBase<float> *this,Event *event)

{
  float fVar1;
  int iVar2;
  bool bVar3;
  Mouse *pMVar4;
  float *pfVar5;
  bool local_49;
  undefined1 local_38 [16];
  unique_ptr<ftxui::CapturedMouseInterface,_std::default_delete<ftxui::CapturedMouseInterface>_>
  local_28;
  Event *local_20;
  Event *event_local;
  SliderBase<float> *this_local;
  
  local_20 = event;
  event_local = (Event *)this;
  bVar3 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->captured_mouse_);
  if ((bVar3) && (pMVar4 = Event::mouse(event), pMVar4->motion == Released)) {
    std::
    unique_ptr<ftxui::CapturedMouseInterface,_std::default_delete<ftxui::CapturedMouseInterface>_>::
    operator=(&this->captured_mouse_,(nullptr_t)0x0);
    this_local._7_1_ = true;
  }
  else {
    pMVar4 = Event::mouse(event);
    iVar2 = pMVar4->x;
    pMVar4 = Event::mouse(event);
    bVar3 = Box::Contain(&this->box_,iVar2,pMVar4->y);
    local_38[0xf] = 0;
    local_49 = false;
    if (bVar3) {
      ComponentBase::CaptureMouse((ComponentBase *)&local_28,(Event *)this);
      local_38[0xf] = 1;
      local_49 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_28);
    }
    if ((local_38[0xf] & 1) != 0) {
      std::
      unique_ptr<ftxui::CapturedMouseInterface,_std::default_delete<ftxui::CapturedMouseInterface>_>
      ::~unique_ptr(&local_28);
    }
    if (local_49 != false) {
      ComponentBase::TakeFocus(&this->super_ComponentBase);
    }
    pMVar4 = Event::mouse(event);
    if ((pMVar4->button == Left) && (pMVar4 = Event::mouse(event), pMVar4->motion == Pressed)) {
      pMVar4 = Event::mouse(event);
      iVar2 = pMVar4->x;
      pMVar4 = Event::mouse(event);
      bVar3 = Box::Contain(&this->gauge_box_,iVar2,pMVar4->y);
      if ((bVar3) &&
         (bVar3 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->captured_mouse_),
         !bVar3)) {
        ComponentBase::CaptureMouse((ComponentBase *)local_38,(Event *)this);
        std::
        unique_ptr<ftxui::CapturedMouseInterface,_std::default_delete<ftxui::CapturedMouseInterface>_>
        ::operator=(&this->captured_mouse_,
                    (unique_ptr<ftxui::CapturedMouseInterface,_std::default_delete<ftxui::CapturedMouseInterface>_>
                     *)local_38);
        std::
        unique_ptr<ftxui::CapturedMouseInterface,_std::default_delete<ftxui::CapturedMouseInterface>_>
        ::~unique_ptr((unique_ptr<ftxui::CapturedMouseInterface,_std::default_delete<ftxui::CapturedMouseInterface>_>
                       *)local_38);
      }
    }
    bVar3 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->captured_mouse_);
    if (bVar3) {
      fVar1 = this->min_;
      pMVar4 = Event::mouse(event);
      *this->value_ =
           fVar1 + ((float)(pMVar4->x - (this->gauge_box_).x_min) * (this->max_ - this->min_)) /
                   (float)((this->gauge_box_).x_max - (this->gauge_box_).x_min);
      pfVar5 = std::min<float>(&this->max_,this->value_);
      pfVar5 = std::max<float>(&this->min_,pfVar5);
      *this->value_ = *pfVar5;
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool OnMouseEvent(Event event) {
    if (captured_mouse_ && event.mouse().motion == Mouse::Released) {
      captured_mouse_ = nullptr;
      return true;
    }

    if (box_.Contain(event.mouse().x, event.mouse().y) && CaptureMouse(event)) {
      TakeFocus();
    }

    if (event.mouse().button == Mouse::Left &&
        event.mouse().motion == Mouse::Pressed &&
        gauge_box_.Contain(event.mouse().x, event.mouse().y) &&
        !captured_mouse_) {
      captured_mouse_ = CaptureMouse(event);
    }

    if (captured_mouse_) {
      *value_ = min_ + (event.mouse().x - gauge_box_.x_min) * (max_ - min_) /
                           (gauge_box_.x_max - gauge_box_.x_min);
      *value_ = std::max(min_, std::min(max_, *value_));
      return true;
    }
    return false;
  }